

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool P_IsTIDUsed(int tid)

{
  AActor *local_18;
  AActor *probe;
  int tid_local;
  
  local_18 = AActor::TIDHash[(int)(tid & 0x7f)];
  while( true ) {
    if (local_18 == (AActor *)0x0) {
      return false;
    }
    if (local_18->tid == tid) break;
    local_18 = local_18->inext;
  }
  return true;
}

Assistant:

bool P_IsTIDUsed(int tid)
{
	AActor *probe = AActor::TIDHash[tid & 127];
	while (probe != NULL)
	{
		if (probe->tid == tid)
		{
			return true;
		}
		probe = probe->inext;
	}
	return false;
}